

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

void look_mon_desc(char *buf,size_t max,wchar_t m_idx)

{
  _Bool _Var1;
  int iVar2;
  monster_conflict *mon_00;
  char *pcVar3;
  bool local_29;
  wchar_t perc;
  _Bool living;
  monster *mon;
  wchar_t m_idx_local;
  size_t max_local;
  char *buf_local;
  
  mon_00 = cave_monster(cave,m_idx);
  if (mon_00 != (monster_conflict *)0x0) {
    _Var1 = monster_is_destroyed((monster *)mon_00);
    local_29 = !_Var1;
    if (mon_00->hp < mon_00->maxhp) {
      iVar2 = (int)(((long)mon_00->hp * 100) / (long)mon_00->maxhp);
      if (iVar2 < 0x3c) {
        if (iVar2 < 0x19) {
          if (iVar2 < 10) {
            pcVar3 = "almost destroyed";
            if (local_29) {
              pcVar3 = "almost dead";
            }
            my_strcpy(buf,pcVar3,max);
          }
          else {
            pcVar3 = "badly damaged";
            if (local_29) {
              pcVar3 = "badly wounded";
            }
            my_strcpy(buf,pcVar3,max);
          }
        }
        else {
          pcVar3 = "somewhat damaged";
          if (local_29) {
            pcVar3 = "somewhat wounded";
          }
          my_strcpy(buf,pcVar3 + 9,max);
        }
      }
      else {
        pcVar3 = "somewhat damaged";
        if (local_29) {
          pcVar3 = "somewhat wounded";
        }
        my_strcpy(buf,pcVar3,max);
      }
    }
    else {
      pcVar3 = "undamaged";
      if (local_29) {
        pcVar3 = "unhurt";
      }
      my_strcpy(buf,pcVar3,max);
    }
    if (mon_00->m_timed[0] != 0) {
      my_strcat(buf,", asleep",max);
    }
    if (mon_00->m_timed[6] != 0) {
      my_strcat(buf,", held",max);
    }
    if (mon_00->m_timed[7] != 0) {
      my_strcat(buf,", disenchanted",max);
    }
    if (mon_00->m_timed[2] != 0) {
      my_strcat(buf,", confused",max);
    }
    if (mon_00->m_timed[3] != 0) {
      my_strcat(buf,", afraid",max);
    }
    if (mon_00->m_timed[1] != 0) {
      my_strcat(buf,", stunned",max);
    }
    if (mon_00->m_timed[4] != 0) {
      my_strcat(buf,", slowed",max);
    }
    if (mon_00->m_timed[5] != 0) {
      my_strcat(buf,", hasted",max);
    }
    _Var1 = flag_has_dbg(mon_00->race->flags,0xc,0x24,"mon->race->flags","RF_PLAYER");
    if (_Var1) {
      if ((mon_00->target).midx < L'\0') {
        my_strcat(buf,", hostile",max);
      }
      else {
        my_strcat(buf,", neutral",max);
      }
    }
  }
  return;
}

Assistant:

void look_mon_desc(char *buf, size_t max, int m_idx)
{
	struct monster *mon = cave_monster(cave, m_idx);

	bool living = true;

	if (!mon) return;

	/* Determine if the monster is "living" (vs "undead") */
	if (monster_is_destroyed(mon)) living = false;

	/* Assess health */
	if (mon->hp >= mon->maxhp) {
		/* No damage */
		my_strcpy(buf, (living ? "unhurt" : "undamaged"), max);
	} else {
		/* Calculate a health "percentage" */
		int perc = 100L * mon->hp / mon->maxhp;

		if (perc >= 60)
			my_strcpy(buf, (living ? "somewhat wounded" : "somewhat damaged"),
					  max);
		else if (perc >= 25)
			my_strcpy(buf, (living ? "wounded" : "damaged"), max);
		else if (perc >= 10)
			my_strcpy(buf, (living ? "badly wounded" : "badly damaged"), max);
		else
			my_strcpy(buf, (living ? "almost dead" : "almost destroyed"), max);
	}

	/* Effect status */
	if (mon->m_timed[MON_TMD_SLEEP]) my_strcat(buf, ", asleep", max);
	if (mon->m_timed[MON_TMD_HOLD]) my_strcat(buf, ", held", max);
	if (mon->m_timed[MON_TMD_DISEN]) my_strcat(buf, ", disenchanted", max);
	if (mon->m_timed[MON_TMD_CONF]) my_strcat(buf, ", confused", max);
	if (mon->m_timed[MON_TMD_FEAR]) my_strcat(buf, ", afraid", max);
	if (mon->m_timed[MON_TMD_STUN]) my_strcat(buf, ", stunned", max);
	if (mon->m_timed[MON_TMD_SLOW]) my_strcat(buf, ", slowed", max);
	if (mon->m_timed[MON_TMD_FAST]) my_strcat(buf, ", hasted", max);

	/* Hostility */
	if (rf_has(mon->race->flags, RF_PLAYER)) {
		if (mon->target.midx < 0) {
			/* Hostile monsters */
			my_strcat(buf, ", hostile", max);
		} else {
			/* Not hostile to the player */
			my_strcat(buf, ", neutral", max);
		}
	}
}